

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minify_tests.c
# Opt level: O1

void cjson_minify_should_not_overflow_buffer(void)

{
  long in_FS_OFFSET;
  char pending_escape [3];
  char unclosed_multiline_comment [7];
  char local_2c [4];
  char local_28 [8];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  builtin_strncpy(local_28,"/* bla",7);
  local_2c[2] = 0;
  local_2c[0] = '\"';
  local_2c[1] = '\\';
  cJSON_Minify(local_28);
  UnityAssertEqualString("",local_28,(char *)0x0,0x26);
  cJSON_Minify(local_2c);
  UnityAssertEqualString("\"\\",local_2c,(char *)0x0,0x29);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void cjson_minify_should_not_overflow_buffer(void)
{
    char unclosed_multiline_comment[] = "/* bla";
    char pending_escape[] = "\"\\";

    cJSON_Minify(unclosed_multiline_comment);
    TEST_ASSERT_EQUAL_STRING("", unclosed_multiline_comment);

    cJSON_Minify(pending_escape);
    TEST_ASSERT_EQUAL_STRING("\"\\", pending_escape);
}